

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip4-addr.c
# Opt level: O2

int run_test_ip4_addr(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined8 uStack_30;
  sockaddr_in addr;
  char dst [16];
  
  iVar1 = uv_inet_ntop(2,anon_var_dwarf_361d2,dst,0x10);
  if (iVar1 == 0) {
    auVar4[0] = -(dst[0] == '2');
    auVar4[1] = -(dst[1] == '5');
    auVar4[2] = -(dst[2] == '5');
    auVar4[3] = -(dst[3] == '.');
    auVar4[4] = -(dst[4] == '2');
    auVar4[5] = -(dst[5] == '5');
    auVar4[6] = -(dst[6] == '5');
    auVar4[7] = -(dst[7] == '.');
    auVar4[8] = -(dst[8] == '2');
    auVar4[9] = -(dst[9] == '5');
    auVar4[10] = -(dst[10] == '5');
    auVar4[0xb] = -(dst[0xb] == '.');
    auVar4[0xc] = -(dst[0xc] == '2');
    auVar4[0xd] = -(dst[0xd] == '5');
    auVar4[0xe] = -(dst[0xe] == '5');
    auVar4[0xf] = -(dst[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        == 0xffff) {
      iVar1 = uv_inet_ntop(2,anon_var_dwarf_361d2,dst,0xf);
      if (iVar1 == -0x1c) {
        iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("255.255.255.255",0x23a3,&addr);
          if (iVar1 == 0) {
            iVar1 = uv_ip4_addr("255.255.255*000",0x23a3,&addr);
            if (iVar1 == -0x16) {
              iVar1 = uv_ip4_addr("255.255.255.256",0x23a3,&addr);
              if (iVar1 == -0x16) {
                iVar1 = uv_ip4_addr("2555.0.0.0",0x23a3,&addr);
                if (iVar1 == -0x16) {
                  iVar1 = uv_ip4_addr("255",0x23a3,&addr);
                  if (iVar1 == -0x16) {
                    iVar1 = uv_inet_pton(0x2a,"127.0.0.1",&addr.sin_addr);
                    if (iVar1 == -0x61) {
                      uVar2 = uv_default_loop();
                      uv_walk(uVar2,close_walk_cb,0);
                      uv_run(uVar2,0);
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                      uStack_30 = 0x35;
                    }
                    else {
                      pcVar3 = 
                      "UV_EAFNOSUPPORT == uv_inet_pton(42, \"127.0.0.1\", &addr.sin_addr.s_addr)";
                      uStack_30 = 0x33;
                    }
                  }
                  else {
                    pcVar3 = "UV_EINVAL == uv_ip4_addr(\"255\", TEST_PORT, &addr)";
                    uStack_30 = 0x2b;
                  }
                }
                else {
                  pcVar3 = "UV_EINVAL == uv_ip4_addr(\"2555.0.0.0\", TEST_PORT, &addr)";
                  uStack_30 = 0x2a;
                }
              }
              else {
                pcVar3 = "UV_EINVAL == uv_ip4_addr(\"255.255.255.256\", TEST_PORT, &addr)";
                uStack_30 = 0x29;
              }
            }
            else {
              pcVar3 = "UV_EINVAL == uv_ip4_addr(\"255.255.255*000\", TEST_PORT, &addr)";
              uStack_30 = 0x28;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"255.255.255.255\", TEST_PORT, &addr)";
            uStack_30 = 0x27;
          }
        }
        else {
          pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
          uStack_30 = 0x26;
        }
      }
      else {
        pcVar3 = 
        "UV_ENOSPC == uv_inet_ntop(AF_INET, \"\\xFF\\xFF\\xFF\\xFF\", dst, sizeof(dst) - 1)";
        uStack_30 = 0x24;
      }
    }
    else {
      pcVar3 = "0 == strcmp(dst, \"255.255.255.255\")";
      uStack_30 = 0x22;
    }
  }
  else {
    pcVar3 = "0 == uv_inet_ntop(AF_INET, \"\\xFF\\xFF\\xFF\\xFF\", dst, sizeof(dst))";
    uStack_30 = 0x21;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(ip4_addr) {
  struct sockaddr_in addr;
  char dst[16];

  ASSERT(0 == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF", dst, sizeof(dst)));
  ASSERT(0 == strcmp(dst, "255.255.255.255"));
  ASSERT(UV_ENOSPC == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF",
                                   dst, sizeof(dst) - 1));

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("255.255.255.255", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255*000", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255.256", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("2555.0.0.0", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255", TEST_PORT, &addr));

#ifdef SIN6_LEN
  ASSERT(addr.sin_len == sizeof(addr));
#endif

  /* for broken address family */
  ASSERT(UV_EAFNOSUPPORT == uv_inet_pton(42, "127.0.0.1",
    &addr.sin_addr.s_addr));

  MAKE_VALGRIND_HAPPY();
  return 0;
}